

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O1

void __thiscall
pfederc::ClassExpr::ClassExpr
          (ClassExpr *this,Lexer *lexer,Position *pos,
          unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *caps,
          Token *tokId,TemplateDecls *templs,
          list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
          *constructAttributes,
          list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
          *attributes,
          list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
          *functions)

{
  list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
  *plVar1;
  list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
  *plVar2;
  list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
  *plVar3;
  pointer puVar4;
  tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_> tVar5;
  list<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
  *__range1;
  _List_node_base *p_Var6;
  pointer puVar7;
  
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__TokenExpr_0012b6c8;
  (this->super_Expr).parent = (Expr *)0x0;
  (this->super_Expr).lexer = lexer;
  (this->super_Expr).type = EXPR_CLASS;
  (this->super_Expr).pos.line = pos->line;
  (this->super_Expr).pos.startIndex = pos->startIndex;
  (this->super_Expr).pos.endIndex = pos->endIndex;
  (this->super_Capable).caps._M_t.
  super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>.
  super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl =
       (caps->_M_t).
       super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>.
       _M_t.
       super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>.
       super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl;
  (caps->_M_t).
  super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>.
  super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl = (Capabilities *)0x0;
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__ClassExpr_0012b830;
  this->tokId = tokId;
  (this->templs).
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (templs->
       super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->templs).
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (templs->
       super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  (this->templs).
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (templs->
       super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (templs->
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (templs->
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (templs->
  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  plVar1 = &this->constructAttributes;
  (this->constructAttributes).
  super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next =
       (constructAttributes->
       super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
       )._M_impl._M_node.super__List_node_base._M_next;
  p_Var6 = (constructAttributes->
           super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
           )._M_impl._M_node.super__List_node_base._M_prev;
  (this->constructAttributes).
  super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = p_Var6;
  (this->constructAttributes).
  super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
  ._M_impl._M_node._M_size =
       (constructAttributes->
       super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
       )._M_impl._M_node._M_size;
  if ((constructAttributes->
      super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
      )._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)constructAttributes) {
    (this->constructAttributes).
    super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar1;
    (this->constructAttributes).
    super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar1;
  }
  else {
    p_Var6->_M_next = (_List_node_base *)plVar1;
    ((plVar1->
     super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
     )._M_impl._M_node.super__List_node_base._M_next)->_M_prev = (_List_node_base *)plVar1;
    (constructAttributes->
    super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
    )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)constructAttributes;
    (constructAttributes->
    super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
    )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)constructAttributes;
    (constructAttributes->
    super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
    )._M_impl._M_node._M_size = 0;
  }
  plVar2 = &this->attributes;
  (this->attributes).
  super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next =
       (attributes->
       super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
       )._M_impl._M_node.super__List_node_base._M_next;
  p_Var6 = (attributes->
           super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
           )._M_impl._M_node.super__List_node_base._M_prev;
  (this->attributes).
  super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = p_Var6;
  (this->attributes).
  super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
  ._M_impl._M_node._M_size =
       (attributes->
       super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
       )._M_impl._M_node._M_size;
  if ((attributes->
      super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
      )._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)attributes) {
    (this->attributes).
    super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar2;
    (this->attributes).
    super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar2;
  }
  else {
    p_Var6->_M_next = (_List_node_base *)plVar2;
    ((plVar2->
     super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
     )._M_impl._M_node.super__List_node_base._M_next)->_M_prev = (_List_node_base *)plVar2;
    (attributes->
    super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
    )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)attributes;
    (attributes->
    super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
    )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)attributes;
    (attributes->
    super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
    )._M_impl._M_node._M_size = 0;
  }
  plVar3 = &this->functions;
  (this->functions).
  super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next =
       (functions->
       super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
       )._M_impl._M_node.super__List_node_base._M_next;
  p_Var6 = (functions->
           super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
           )._M_impl._M_node.super__List_node_base._M_prev;
  (this->functions).
  super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = p_Var6;
  (this->functions).
  super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
  ._M_impl._M_node._M_size =
       (functions->
       super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
       )._M_impl._M_node._M_size;
  if ((functions->
      super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
      )._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)functions) {
    (this->functions).
    super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar3;
    (this->functions).
    super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar3;
  }
  else {
    p_Var6->_M_next = (_List_node_base *)plVar3;
    ((plVar3->
     super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
     )._M_impl._M_node.super__List_node_base._M_next)->_M_prev = (_List_node_base *)plVar3;
    (functions->
    super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
    )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)functions;
    (functions->
    super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
    )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)functions;
    (functions->
    super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
    )._M_impl._M_node._M_size = 0;
  }
  if (this->tokId != (Token *)0x0) {
    puVar4 = (this->templs).
             super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar7 = (this->templs).
                  super__Vector_base<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar4; puVar7 = puVar7 + 1)
    {
      tVar5.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
      super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
           *(_Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_> *)
            &(((puVar7->_M_t).
               super___uniq_ptr_impl<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>
               ._M_t.
               super__Tuple_impl<0UL,_pfederc::TemplateDecl_*,_std::default_delete<pfederc::TemplateDecl>_>
               .super__Head_base<0UL,_pfederc::TemplateDecl_*,_false>._M_head_impl)->expr)._M_t.
             super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>;
      if (tVar5.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
          super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl !=
          (_Head_base<0UL,_pfederc::Expr_*,_false>)0x0) {
        *(ClassExpr **)
         ((long)tVar5.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
                super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl + 8) = this;
      }
    }
    for (p_Var6 = (plVar1->
                  super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
                  )._M_impl._M_node.super__List_node_base._M_next;
        p_Var6 != (_List_node_base *)plVar1; p_Var6 = p_Var6->_M_next) {
      (p_Var6[1]._M_next)->_M_prev = (_List_node_base *)this;
    }
    for (p_Var6 = (plVar2->
                  super__List_base<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>,_std::allocator<std::unique_ptr<pfederc::BiOpExpr,_std::default_delete<pfederc::BiOpExpr>_>_>_>
                  )._M_impl._M_node.super__List_node_base._M_next;
        p_Var6 != (_List_node_base *)plVar2; p_Var6 = p_Var6->_M_next) {
      (p_Var6[1]._M_next)->_M_prev = (_List_node_base *)this;
    }
    for (p_Var6 = (plVar3->
                  super__List_base<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
                  )._M_impl._M_node.super__List_node_base._M_next;
        p_Var6 != (_List_node_base *)plVar3; p_Var6 = p_Var6->_M_next) {
      (p_Var6[1]._M_next)->_M_prev = (_List_node_base *)this;
    }
    return;
  }
  __assert_fail("this->tokId",
                "/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/expr.cpp"
                ,0x18b,
                "pfederc::ClassExpr::ClassExpr(const Lexer &, const Position &, std::unique_ptr<Capabilities> &&, const Token *, TemplateDecls &&, std::list<std::unique_ptr<BiOpExpr>> &&, std::list<std::unique_ptr<BiOpExpr>> &&, std::list<std::unique_ptr<FuncExpr>> &&)"
               );
}

Assistant:

ClassExpr::ClassExpr(const Lexer &lexer, const Position &pos,
    std::unique_ptr<Capabilities> &&caps,
    const Token *tokId,
    TemplateDecls &&templs,
    std::list<std::unique_ptr<BiOpExpr>> &&constructAttributes,
    std::list<std::unique_ptr<BiOpExpr>> &&attributes,
    std::list<std::unique_ptr<FuncExpr>> &&functions) noexcept
    : Expr(lexer, ExprType::EXPR_CLASS, pos), Capable(std::move(caps)), tokId{tokId},
      templs(std::move(templs)),
      constructAttributes(std::move(constructAttributes)),
      attributes(std::move(attributes)),
      functions(std::move(functions)) {
  assert(this->tokId);

  _setTemplateParents(this->templs, this);
  _setParents(this->constructAttributes, this);
  _setParents(this->attributes, this);
  _setParents(this->functions, this);
}